

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O2

tsd_t * duckdb_je_malloc_tsd_boot0(void)

{
  _Bool _Var1;
  int iVar2;
  tsd_t *tsd;
  long *in_FS_OFFSET;
  
  tsd = (tsd_t *)0x0;
  _Var1 = duckdb_je_malloc_mutex_init
                    (&tsd_nominal_tsds_lock,"tsd_nominal_tsds_lock",WITNESS_RANK_OMIT,
                     malloc_mutex_rank_exclusive);
  if (!_Var1) {
    iVar2 = pthread_key_create(&duckdb_je_tsd_tsd,duckdb_je_tsd_cleanup);
    if (iVar2 == 0) {
      duckdb_je_tsd_booted = true;
      tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
      if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
        duckdb_je_tsd_fetch_slow(tsd,false);
      }
    }
    else {
      tsd = (tsd_t *)0x0;
    }
  }
  return tsd;
}

Assistant:

tsd_t *
malloc_tsd_boot0(void) {
	tsd_t *tsd;

#if defined(JEMALLOC_MALLOC_THREAD_CLEANUP) || defined(_WIN32)
	ncleanups = 0;
#endif
	if (malloc_mutex_init(&tsd_nominal_tsds_lock, "tsd_nominal_tsds_lock",
	    WITNESS_RANK_OMIT, malloc_mutex_rank_exclusive)) {
		return NULL;
	}
	if (tsd_boot0()) {
		return NULL;
	}
	tsd = tsd_fetch();
	return tsd;
}